

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

int __thiscall QTreeViewPrivate::pageUp(QTreeViewPrivate *this,int i)

{
  QWidgetData *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar3 = coordinateForItem(this,i);
  pQVar1 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->data;
  iVar3 = itemAtCoordinate(this,~(pQVar1->crect).y2.m_i + iVar3 + (pQVar1->crect).y1.m_i);
  iVar3 = iVar3 + 1;
  do {
    iVar3 = iVar3 + -1;
    bVar2 = isItemHiddenOrDisabled(this,iVar3);
  } while (bVar2);
  iVar4 = 0;
  if (iVar3 != -1) {
    iVar4 = iVar3;
  }
  lVar6 = (long)iVar4;
  lVar5 = lVar6 + -1;
  do {
    bVar2 = isItemHiddenOrDisabled(this,(int)lVar6);
    lVar5 = lVar5 + 1;
    lVar6 = lVar6 + 1;
  } while (bVar2);
  iVar3 = (int)lVar5;
  if ((this->viewItems).d.size <= lVar5) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int QTreeViewPrivate::pageUp(int i) const
{
    int index = itemAtCoordinate(coordinateForItem(i) - viewport->height());
    while (isItemHiddenOrDisabled(index))
        index--;
    if (index == -1)
        index = 0;
    while (isItemHiddenOrDisabled(index))
        index++;
    return index >= viewItems.size() ? 0 : index;
}